

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Value.cpp
# Opt level: O0

void __thiscall soul::Value::Value(Value *this,Type *t)

{
  uint64_t size;
  Type *t_local;
  Value *this_local;
  
  Type::Type(&this->type,t);
  size = Type::getPackedSizeInBytes(&this->type);
  LazyAllocatedData::LazyAllocatedData(&this->allocatedData,size);
  return;
}

Assistant:

Value::Value (Type t)  : type (std::move (t)), allocatedData ((size_t) type.getPackedSizeInBytes()) {}